

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

GradleBuildConfigs * gradleBuildConfigs(QString *path)

{
  QByteArrayView bv;
  QByteArrayView bv_00;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  anon_class_1_0_00000001 *this;
  QString *in_RSI;
  GradleBuildConfigs *in_RDI;
  long in_FS_OFFSET;
  bool doubleQuoted;
  bool singleQuoted;
  QByteArray *line;
  QList<QByteArray> *__range1;
  GradleBuildConfigs *configs;
  QString value;
  QByteArray trimmedLine;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QByteArray> lines;
  anon_class_1_0_00000001 extractValue;
  anon_class_1_0_00000001 isComment;
  QFile file;
  undefined4 in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffecc;
  byte in_stack_fffffffffffffece;
  byte in_stack_fffffffffffffecf;
  GradleBuildConfigs *data;
  undefined6 in_stack_fffffffffffffee0;
  byte in_stack_fffffffffffffee6;
  byte in_stack_fffffffffffffee7;
  undefined1 local_f0 [24];
  QChar local_d8;
  QChar local_d6;
  QChar local_d4;
  QChar local_d2 [13];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  QByteArray *local_68;
  const_iterator local_60;
  const_iterator local_58 [4];
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->appNamespace).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->appNamespace).d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->appNamespace).d.size = -0x5555555555555556;
  *(undefined8 *)&in_RDI->usesIntegerCompileSdkVersion = 0xaaaaaaaaaaaaaaaa;
  data = in_RDI;
  GradleBuildConfigs::GradleBuildConfigs(in_RDI);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_18,in_RSI);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_RDI,
             CONCAT13(in_stack_fffffffffffffecf,
                      CONCAT12(in_stack_fffffffffffffece,in_stack_fffffffffffffecc)));
  uVar3 = QFile::open((QFlags *)&local_18);
  if ((uVar3 & 1) != 0) {
    local_1d = 0xaa;
    local_1e = 0xaa;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    QByteArray::split((char)&local_38);
    QByteArray::~QByteArray((QByteArray *)0x10d297);
    local_58[0].i = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    local_58[0] = QList<QByteArray>::begin((QList<QByteArray> *)in_RDI);
    local_60.i = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    local_60 = QList<QByteArray>::end((QList<QByteArray> *)in_RDI);
    while( true ) {
      local_68 = local_60.i;
      bVar1 = QList<QByteArray>::const_iterator::operator!=(local_58,local_60);
      if (!bVar1) break;
      this = (anon_class_1_0_00000001 *)QList<QByteArray>::const_iterator::operator*(local_58);
      local_80 = 0xaaaaaaaaaaaaaaaa;
      local_78 = 0xaaaaaaaaaaaaaaaa;
      local_70 = 0xaaaaaaaaaaaaaaaa;
      QByteArray::trimmed((QByteArray *)
                          CONCAT17(in_stack_fffffffffffffecf,
                                   CONCAT16(in_stack_fffffffffffffece,
                                            CONCAT24(in_stack_fffffffffffffecc,
                                                     in_stack_fffffffffffffec8))));
      bVar1 = gradleBuildConfigs::anon_class_1_0_00000001::operator()
                        (this,(QByteArray *)
                              CONCAT17(in_stack_fffffffffffffee7,
                                       CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)
                                      ));
      if (!bVar1) {
        QByteArrayView::QByteArrayView<55ul>
                  ((QByteArrayView *)
                   CONCAT17(in_stack_fffffffffffffee7,
                            CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)),
                   (char (*) [55])data);
        bv.m_size._6_1_ = in_stack_fffffffffffffee6;
        bv.m_size._0_6_ = in_stack_fffffffffffffee0;
        bv.m_size._7_1_ = in_stack_fffffffffffffee7;
        bv.m_data = (storage_type_conflict *)this;
        bVar1 = QByteArray::contains
                          ((QByteArray *)
                           CONCAT17(in_stack_fffffffffffffecf,
                                    CONCAT16(in_stack_fffffffffffffece,
                                             CONCAT24(in_stack_fffffffffffffecc,
                                                      in_stack_fffffffffffffec8))),bv);
        if (bVar1) {
          in_RDI->usesIntegerCompileSdkVersion = true;
        }
        else {
          QByteArrayView::QByteArrayView<10ul>
                    ((QByteArrayView *)
                     CONCAT17(in_stack_fffffffffffffee7,
                              CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)),
                     (char (*) [10])data);
          bv_00.m_size._6_1_ = in_stack_fffffffffffffee6;
          bv_00.m_size._0_6_ = in_stack_fffffffffffffee0;
          bv_00.m_size._7_1_ = in_stack_fffffffffffffee7;
          bv_00.m_data = (storage_type_conflict *)this;
          bVar1 = QByteArray::contains
                            ((QByteArray *)
                             CONCAT17(in_stack_fffffffffffffecf,
                                      CONCAT16(in_stack_fffffffffffffece,
                                               CONCAT24(in_stack_fffffffffffffecc,
                                                        in_stack_fffffffffffffec8))),bv_00);
          if (bVar1) {
            local_b8 = 0xaaaaaaaaaaaaaaaa;
            local_b0 = 0xaaaaaaaaaaaaaaaa;
            local_a8 = 0xaaaaaaaaaaaaaaaa;
            gradleBuildConfigs::anon_class_1_0_00000001::operator()
                      (this,(QByteArray *)
                            CONCAT17(in_stack_fffffffffffffee7,
                                     CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)))
            ;
            QString::fromUtf8<void>((QByteArray *)in_RDI);
            QByteArray::~QByteArray((QByteArray *)0x10d48d);
            QChar::QChar<char16_t,_true>(local_d2,L'\'');
            uVar2 = QString::startsWith((QChar)(char16_t)&local_b8,(uint)(ushort)local_d2[0].ucs);
            in_stack_fffffffffffffecf = 0;
            if ((uVar2 & 1) != 0) {
              QChar::QChar<char16_t,_true>(&local_d4,L'\'');
              in_stack_fffffffffffffecf =
                   QString::endsWith((QChar)(char16_t)&local_b8,(uint)(ushort)local_d4.ucs);
            }
            in_stack_fffffffffffffee7 = in_stack_fffffffffffffecf & 1;
            QChar::QChar<char16_t,_true>(&local_d6,L'\"');
            uVar2 = QString::startsWith((QChar)(char16_t)&local_b8,(uint)(ushort)local_d6.ucs);
            in_stack_fffffffffffffece = 0;
            if ((uVar2 & 1) != 0) {
              QChar::QChar<char16_t,_true>(&local_d8,L'\"');
              in_stack_fffffffffffffece =
                   QString::endsWith((QChar)(char16_t)&local_b8,(uint)(ushort)local_d8.ucs);
            }
            in_stack_fffffffffffffee6 = in_stack_fffffffffffffece & 1;
            if (((in_stack_fffffffffffffee7 & 1) == 0) && (in_stack_fffffffffffffee6 == 0)) {
              QString::operator=(&in_RDI->appNamespace,(QString *)&local_b8);
            }
            else {
              QString::length((QString *)0x10d57a);
              QString::mid((longlong)local_f0,(longlong)&local_b8);
              QString::operator=(&in_RDI->appNamespace,
                                 (QString *)
                                 CONCAT17(in_stack_fffffffffffffecf,
                                          CONCAT16(in_stack_fffffffffffffece,
                                                   CONCAT24(in_stack_fffffffffffffecc,
                                                            in_stack_fffffffffffffec8))));
              QString::~QString((QString *)0x10d5b1);
            }
            QString::~QString((QString *)0x10d5d2);
          }
        }
      }
      QByteArray::~QByteArray((QByteArray *)0x10d5e9);
      QList<QByteArray>::const_iterator::operator++(local_58);
    }
    QList<QByteArray>::~QList((QList<QByteArray> *)0x10d623);
  }
  QFile::~QFile((QFile *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return data;
  }
  __stack_chk_fail();
}

Assistant:

GradleBuildConfigs gradleBuildConfigs(const QString &path)
{
    GradleBuildConfigs configs;

    QFile file(path);
    if (!file.open(QIODevice::ReadOnly))
        return configs;

    auto isComment = [](const QByteArray &trimmed) {
        return trimmed.startsWith("//") || trimmed.startsWith('*') || trimmed.startsWith("/*");
    };

    auto extractValue = [](const QByteArray &trimmed) {
        int idx = trimmed.indexOf('=');

        if (idx == -1)
            idx = trimmed.indexOf(' ');

        if (idx > -1)
            return trimmed.mid(idx + 1).trimmed();

        return QByteArray();
    };

    const auto lines = file.readAll().split('\n');
    for (const auto &line : lines) {
        const QByteArray trimmedLine = line.trimmed();
        if (isComment(trimmedLine))
            continue;
        if (trimmedLine.contains("compileSdkVersion androidCompileSdkVersion.toInteger()")) {
            configs.usesIntegerCompileSdkVersion = true;
        } else if (trimmedLine.contains("namespace")) {
            const QString value = QString::fromUtf8(extractValue(trimmedLine));
            const bool singleQuoted = value.startsWith(u'\'') && value.endsWith(u'\'');
            const bool doubleQuoted = value.startsWith(u'\"') && value.endsWith(u'\"');

            if (singleQuoted || doubleQuoted)
                configs.appNamespace = value.mid(1, value.length() - 2);
            else
                configs.appNamespace = value;
        }
    }

    return configs;
}